

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfftpack.c
# Opt level: O0

int dct1_forward(fft_t *f,double *data)

{
  double *in_RSI;
  int *in_RDI;
  double *unaff_retaddr;
  fft_t *in_stack_00000008;
  int ier;
  int *in_stack_00000030;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RDI == (int *)0x0) || (in_RSI == (double *)0x0)) {
    iVar1 = -1;
  }
  else if (in_RDI[9] == 4) {
    iVar1 = 0;
    if (in_RDI[10] == 0) {
      cost1f_((int *)in_stack_00000008,(int *)unaff_retaddr,
              (double *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
              (int *)(ulong)in_stack_ffffffffffffffe0,data,(int *)f,in_stack_00000030);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = cfftpack_orthogonal_dct1(in_stack_00000008,unaff_retaddr);
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int dct1_forward(fft_t *f, fft_real_t *data){
  if (!f || !data)
    return -1;
  if (f->algo != ALGO_DCT1)
    return -2;
  int ier=0;
  if (!f->ortho){
    // forward DCT-I
    cost1f_(&f->n, &f->inc, data, &f->n, f->save, &f->lensav, f->work, &f->lenwork, &ier);
    if (ier)
      return ier;
  }else{
    return cfftpack_orthogonal_dct1(f,data);
  }
  return 0;
}